

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckNamespace.cxx
# Opt level: O0

bool __thiscall kws::Parser::CheckNamespace(Parser *this,char *name,bool doNotCheckMain)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  byte in_DL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_RDI;
  Error error_1;
  string nspace;
  string names;
  bool ok;
  Error error;
  size_t pos;
  string nameSpace;
  char *val;
  size_t length;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  value_type *in_stack_fffffffffffffe48;
  value_type *__x;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  undefined8 in_stack_fffffffffffffe58;
  undefined1 uVar4;
  size_t in_stack_fffffffffffffe60;
  allocator *pos_00;
  Parser *in_stack_fffffffffffffe68;
  size_t in_stack_fffffffffffffe90;
  Parser *in_stack_fffffffffffffe98;
  string local_160 [32];
  string local_140 [39];
  allocator<char> local_119;
  string local_118 [39];
  allocator local_f1;
  undefined8 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff1f;
  size_t in_stack_ffffffffffffff20;
  Parser *in_stack_ffffffffffffff28;
  string local_d0 [35];
  byte local_ad;
  int local_ac;
  long local_a8;
  long local_a0;
  undefined8 local_98;
  string local_90 [32];
  long local_70;
  allocator local_51;
  string local_50 [32];
  char *local_30;
  undefined8 local_28;
  byte local_19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  byte local_1;
  
  uVar4 = (undefined1)((ulong)in_stack_fffffffffffffe58 >> 0x38);
  local_19 = in_DL & 1;
  local_18 = in_RSI;
  if ((local_19 != 0) &&
     ((lVar3 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e5fb9), lVar3 != -1 ||
      (lVar3 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e5fbf), lVar3 == -1)))) {
    local_1 = 0;
    goto LAB_001ae51e;
  }
  *(undefined1 *)(in_RDI + 0x41) = 1;
  local_28 = 0xff;
  local_30 = (char *)operator_new__(0xff);
  snprintf(local_30,0xff,"The first namespace of the file should match %s",local_18);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x278),local_30);
  if (local_30 != (char *)0x0) {
    operator_delete__(local_30);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"",&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  lVar3 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e5c99);
  local_70 = lVar3;
  if (lVar3 == -1) {
    ErrorStruct::ErrorStruct((ErrorStruct *)0x1ae12a);
    local_a8 = GetLineNumber(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,(bool)uVar4);
    local_98 = 0x11;
    local_a0 = local_a8;
    std::__cxx11::string::operator=(local_90,"namespace not defined");
    std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
              ((vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)
               CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
               in_stack_fffffffffffffe48);
    local_1 = 0;
    local_ac = 1;
    ErrorStruct::~ErrorStruct((ErrorStruct *)0x1ae1b7);
  }
  else {
    local_ad = 1;
    pos_00 = &local_f1;
    std::allocator<char>::allocator();
    uVar4 = (undefined1)((ulong)lVar3 >> 0x38);
    std::__cxx11::string::string((string *)&stack0xffffffffffffff10,"",pos_00);
    FindPreviousWord(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                     (bool)in_stack_ffffffffffffff1f,(string *)in_stack_ffffffffffffff10);
    bVar1 = std::operator==(in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
    std::__cxx11::string::~string(local_d0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    if ((bVar1 & 1) != 0) {
      local_ad = 0;
    }
    if ((local_ad & 1) != 0) {
      __x = (value_type *)&local_119;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_118,(char *)local_18,(allocator *)__x);
      std::allocator<char>::~allocator(&local_119);
      FindNextWord_abi_cxx11_(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
      bVar2 = std::operator!=(local_18,in_stack_fffffffffffffe38);
      if (bVar2) {
        ErrorStruct::ErrorStruct((ErrorStruct *)0x1ae3c5);
        GetLineNumber(in_stack_fffffffffffffe68,(size_t)pos_00,(bool)uVar4);
        std::__cxx11::string::operator=(local_160,"namespace is wrong");
        std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                  ((vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)
                   CONCAT17(bVar1,in_stack_fffffffffffffe50),__x);
        local_1 = 0;
        local_ac = 1;
        ErrorStruct::~ErrorStruct((ErrorStruct *)0x1ae43f);
      }
      else {
        local_ac = 0;
      }
      std::__cxx11::string::~string(local_140);
      std::__cxx11::string::~string(local_118);
      if (local_ac != 0) goto LAB_001ae500;
    }
    local_1 = 1;
    local_ac = 1;
  }
LAB_001ae500:
  std::__cxx11::string::~string(local_50);
LAB_001ae51e:
  return (bool)(local_1 & 1);
}

Assistant:

bool Parser::CheckNamespace(const char* name,bool doNotCheckMain)
{
  // If there is a 'int main' keyword in the file we do not check
  // Or if there is not keyword class
  if(doNotCheckMain)
    {
    if( (m_BufferNoComment.find("main ",0) != std::string::npos)
       || (m_BufferNoComment.find("class ",0) == std::string::npos)
      )
      {
      return false;
      }
    }

  m_TestsDone[NAMESPACE] = true;
  constexpr size_t length = 255;
  char* val = new char[length];
  snprintf(val,length,"The first namespace of the file should match %s",name);
  m_TestsDescription[NAMESPACE] = val;
  delete [] val;

  std::string nameSpace = "";

  size_t pos = m_BufferNoComment.find("namespace",0);

  if(pos == std::string::npos)
    {
    Error error;
    error.line = this->GetLineNumber(0,true);
    error.line2 = error.line;
    error.number = NAMESPACE;
    error.description = "namespace not defined";
    m_ErrorList.push_back(error);
    return false;
    }

  
  // check that the word is not using namespace
  bool ok = true;
  if(this->FindPreviousWord(pos) == "using")
    {
    ok = false;
    }

  if(ok)
    {
    std::string names = name;
    // extract the namespace
    std::string nspace = this->FindNextWord(pos);
    if(nspace != names)
      {
      Error error;
      error.line = this->GetLineNumber(pos,true);
      error.line2 = error.line;
      error.number = NAMESPACE;
      error.description = "namespace is wrong";
      m_ErrorList.push_back(error);
      return false;
      }
    }

  /*
  // Now search if we have other namespaces
  while(pos!= std::string::npos && ok)
    {
    pos = buffer.find("namespace",pos+1);
    // check that the word is not using namespace
    use = buffer.find("using",pos-20);

    ok = true;

    if((use!=-1 && pos-use<20) || (pos == -1))
      {
      ok = false;
      }

    if(ok)
      {
      // extract the namespace
      long int bracket = buffer.find("{",pos);
      long int closing = FindClosingBracket(buffer,bracket);

      // Find the number of } after closing
      int num = 0;
      int close = closing+1;
      while(buffer.find("}",close) != -1)
        {
        num++;
        close=buffer.find("}",close);
        close++;
        }

      if(bracket != -1 && bracket-pos-10<10 && num==nNameSpace)
        {
        std::string name = buffer.substr(pos+10,bracket-pos-10);
        RemoveCtrlN(name);
        RemoveChar(name,' ');
        RemoveCtrlN(name);
        nameSpace += "::";
        nameSpace += name;
        nNameSpace++;
        }
      }
    }
    */

  return true;
}